

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O2

int __thiscall
QCommandLinkButtonPrivate::descriptionHeight(QCommandLinkButtonPrivate *this,int widgetWidth)

{
  double dVar1;
  int iVar2;
  undefined4 uVar3;
  long extraout_RDX;
  long in_FS_OFFSET;
  undefined4 uVar4;
  QTextLayout layout;
  double local_60;
  QTextLayout local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = textOffset(this);
  if ((this->description).d.size == 0) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    local_40.d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::QTextLayout(&local_40,(QString *)&this->description);
    descriptionFont((QCommandLinkButtonPrivate *)&local_38);
    QTextLayout::setFont((QFont *)&local_40);
    QFont::~QFont((QFont *)&local_38);
    QTextLayout::beginLayout();
    local_60 = 0.0;
    while( true ) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      uVar3 = QTextLayout::createLine();
      local_38 = (undefined1 *)CONCAT44(local_38._4_4_,uVar3);
      puStack_30 = (undefined1 *)extraout_RDX;
      if (extraout_RDX == 0) break;
      QTextLine::setLineWidth((double)((widgetWidth - iVar2) + -4));
      QTextLine::setPosition((QPointF *)&local_38);
      dVar1 = (double)QTextLine::height();
      local_60 = local_60 + dVar1;
    }
    QTextLayout::endLayout();
    QTextLayout::~QTextLayout(&local_40);
    uVar3 = SUB84(local_60,0);
    uVar4 = (undefined4)((ulong)local_60 >> 0x20);
  }
  dVar1 = ceil((double)CONCAT44(uVar4,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)dVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QCommandLinkButtonPrivate::descriptionHeight(int widgetWidth) const
{
    // Calc width of actual paragraph
    int lineWidth = widgetWidth - textOffset() - rightMargin();

    qreal descriptionheight = 0;
    if (!description.isEmpty()) {
        QTextLayout layout(description);
        layout.setFont(descriptionFont());
        layout.beginLayout();
        while (true) {
            QTextLine line = layout.createLine();
            if (!line.isValid())
                break;
            line.setLineWidth(lineWidth);
            line.setPosition(QPointF(0, descriptionheight));
            descriptionheight += line.height();
        }
        layout.endLayout();
    }
    return qCeil(descriptionheight);
}